

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O3

size_t __thiscall miniscript::Node<CPubKey>::CalcScriptLen(Node<CPubKey> *this)

{
  pointer psVar1;
  pointer psVar2;
  shared_ptr<const_miniscript::Node<CPubKey>_> *sub;
  pointer psVar3;
  size_t sVar4;
  Type sub0typ;
  long in_FS_OFFSET;
  
  psVar1 = (this->subs).
           super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->subs).
           super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  sVar4 = 0;
  psVar3 = psVar1;
  if (psVar1 != psVar2) {
    do {
      sVar4 = sVar4 + ((psVar3->
                       super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr)->scriptlen;
      psVar3 = psVar3 + 1;
    } while (psVar3 != psVar2);
    if (psVar1 != psVar2) {
      sub0typ.m_flags =
           (((psVar1->
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            )->typ).m_flags;
      goto LAB_00717f81;
    }
  }
  sub0typ.m_flags = 0;
LAB_00717f81:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  sVar4 = miniscript::internal::ComputeScriptLen
                    (this->fragment,sub0typ,sVar4,this->k,(long)psVar2 - (long)psVar1 >> 4,
                     ((long)(this->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                           _M_impl.super__Vector_impl_data._M_start) * 0xfc0fc0fc0fc0fc1,
                     this->m_script_ctx);
  return sVar4;
}

Assistant:

size_t CalcScriptLen() const {
        size_t subsize = 0;
        for (const auto& sub : subs) {
            subsize += sub->ScriptSize();
        }
        static constexpr auto NONE_MST{""_mst};
        Type sub0type = subs.size() > 0 ? subs[0]->GetType() : NONE_MST;
        return internal::ComputeScriptLen(fragment, sub0type, subsize, k, subs.size(), keys.size(), m_script_ctx);
    }